

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O1

void __thiscall rw::Geometry::correctTristripWinding(Geometry *this)

{
  void *pvVar1;
  undefined2 uVar2;
  short sVar3;
  uint uVar4;
  MeshHeader *pMVar5;
  long lVar6;
  uint16 uVar7;
  uint16 uVar8;
  MeshHeader *pMVar9;
  void *__src;
  MeshHeader *pMVar10;
  MeshHeader *pMVar11;
  uint uVar12;
  ushort uVar13;
  ulong uVar14;
  bool bVar15;
  
  pMVar5 = this->meshHeader;
  if ((pMVar5 != (MeshHeader *)0x0 && (this->flags & 0x1000000) == 0) && (pMVar5->flags == 1)) {
    this->meshHeader = (MeshHeader *)0x0;
    pMVar9 = allocateMeshes(this,(uint)pMVar5->numMeshes,0,1);
    pMVar9->flags = pMVar5->flags;
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 581"
    ;
    __src = (void *)(*DAT_00149de8)((ulong)(pMVar5->totalIndices * 2) * 2);
    if (pMVar5->numMeshes != 0) {
      pMVar10 = pMVar9 + 1;
      pMVar11 = pMVar5 + 1;
      uVar12 = pMVar9->totalIndices;
      uVar13 = 0;
      do {
        pMVar10->totalIndices = 0;
        pvVar1 = (void *)((long)__src + (ulong)uVar12 * 2);
        *(void **)pMVar10 = pvVar1;
        uVar7 = pMVar11[1].numMeshes;
        uVar8 = pMVar11[1].serialNum;
        pMVar10[1].flags = pMVar11[1].flags;
        pMVar10[1].numMeshes = uVar7;
        pMVar10[1].serialNum = uVar8;
        uVar14 = 0;
        if (pMVar11->totalIndices != 2) {
          lVar6 = *(long *)pMVar11;
          uVar14 = 0;
          bVar15 = false;
          do {
            sVar3 = *(short *)(lVar6 + 2 + uVar14 * 2);
            if ((*(short *)(lVar6 + uVar14 * 2) == sVar3) ||
               (sVar3 == *(short *)(lVar6 + (ulong)((int)uVar14 + 2) * 2))) {
              bVar15 = false;
            }
            else if (!bVar15) {
              uVar4 = pMVar10->totalIndices;
              bVar15 = true;
              if ((uVar4 & 1) != 0) {
                *(undefined2 *)((long)pvVar1 + (ulong)uVar4 * 2) =
                     *(undefined2 *)((long)pvVar1 + (ulong)(uVar4 - 1) * 2);
                pMVar10->totalIndices = uVar4 + 1;
              }
            }
            uVar2 = *(undefined2 *)(lVar6 + uVar14 * 2);
            uVar14 = uVar14 + 1;
            uVar4 = pMVar10->totalIndices;
            pMVar10->totalIndices = uVar4 + 1;
            *(undefined2 *)((long)pvVar1 + (ulong)uVar4 * 2) = uVar2;
          } while (uVar14 < pMVar11->totalIndices - 2);
        }
        if ((uint)uVar14 < pMVar11->totalIndices) {
          lVar6 = *(long *)pMVar11;
          uVar14 = uVar14 & 0xffffffff;
          do {
            uVar2 = *(undefined2 *)(lVar6 + uVar14 * 2);
            uVar4 = pMVar10->totalIndices;
            pMVar10->totalIndices = uVar4 + 1;
            *(undefined2 *)((long)pvVar1 + (ulong)uVar4 * 2) = uVar2;
            uVar14 = uVar14 + 1;
          } while (uVar14 < pMVar11->totalIndices);
        }
        uVar12 = uVar12 + pMVar10->totalIndices;
        pMVar11 = (MeshHeader *)&pMVar11[1].totalIndices;
        pMVar10 = (MeshHeader *)&pMVar10[1].totalIndices;
        uVar13 = uVar13 + 1;
      } while (uVar13 < pMVar5->numMeshes);
      pMVar9->totalIndices = uVar12;
    }
    (*DAT_00149de0)(pMVar5);
    allocateMeshes(this,(uint)pMVar9->numMeshes,pMVar9->totalIndices,0);
    memcpy(*(void **)(this->meshHeader + 1),__src,(ulong)(this->meshHeader->totalIndices * 2));
    (*DAT_00149de0)(__src);
    return;
  }
  return;
}

Assistant:

void
Geometry::correctTristripWinding(void)
{
	MeshHeader *header = this->meshHeader;
	if(this->flags & NATIVE || header == nil ||
	   header->flags != MeshHeader::TRISTRIP)
		return;
	this->meshHeader = nil;
	// Allocate no indices, we realloc later
	MeshHeader *newhead = this->allocateMeshes(header->numMeshes, 0, 1);
	newhead->flags = header->flags;
	/* get a temporary working buffer */
	uint16 *indices = rwNewT(uint16, header->totalIndices*2,
		MEMDUR_FUNCTION | ID_GEOMETRY);

	Mesh *mesh = header->getMeshes();
	Mesh *newmesh = newhead->getMeshes();
	for(uint16 i = 0; i < header->numMeshes; i++){
		newmesh->numIndices = 0;
		newmesh->indices = &indices[newhead->totalIndices];
		newmesh->material = mesh->material;

		bool inStrip = 0;
		uint32 j;
		for(j = 0; j < mesh->numIndices-2; j++){
			/* Duplicate vertices indicate end of strip */
			if(mesh->indices[j] == mesh->indices[j+1] ||
			   mesh->indices[j+1] == mesh->indices[j+2])
				inStrip = 0;
			else if(!inStrip){
				/* Entering strip now,
				 * make sure winding is correct */
				inStrip = 1;
				if(newmesh->numIndices % 2){
					newmesh->indices[newmesh->numIndices] =
					  newmesh->indices[newmesh->numIndices-1];
					newmesh->numIndices++;
				}
			}
			newmesh->indices[newmesh->numIndices++] = mesh->indices[j];
		}
		for(; j < mesh->numIndices; j++)
			newmesh->indices[newmesh->numIndices++] = mesh->indices[j];
		newhead->totalIndices += newmesh->numIndices;

		mesh++;
		newmesh++;
	}
	rwFree(header);
	// Now allocate indices and copy them
	this->allocateMeshes(newhead->numMeshes, newhead->totalIndices, 0);
	memcpy(this->meshHeader->getMeshes()->indices, indices, this->meshHeader->totalIndices*2);
	rwFree(indices);
}